

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

int MergeRopeChunksProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                       Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  void *pvVar2;
  sbyte sVar3;
  long lVar4;
  Col_StringFormat CVar5;
  undefined4 uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  
  lVar4 = *(long *)((long)clientData + 0x68);
  if (lVar4 == 0) {
    CVar5 = chunks->format;
    *(Col_StringFormat *)clientData = CVar5;
  }
  else {
    CVar5 = *clientData;
  }
  CVar1 = chunks->format;
  if (CVar5 - COL_UTF8 < 2) {
    if (CVar1 != CVar5) {
      return -1;
    }
    lVar4 = *(long *)((long)clientData + 0x70);
    sVar9 = chunks->byteLength;
    if (0x5a < sVar9 + lVar4) {
      return -1;
    }
    goto LAB_0010c092;
  }
  if (CVar1 - COL_UTF8 < 2) {
    return -1;
  }
  if ((CVar5 & (COL_UCS4|COL_UCS2|COL_UCS1)) < (CVar1 & (COL_UCS4|COL_UCS2|COL_UCS1))) {
    uVar7 = (lVar4 + length) * (ulong)(CVar1 & (COL_UCS4|COL_UCS2|COL_UCS1));
  }
  else {
    uVar7 = (CVar5 & (COL_UCS4|COL_UCS2|COL_UCS1)) * length + *(long *)((long)clientData + 0x70);
  }
  if (0x5c < uVar7) {
    return -1;
  }
  if (CVar5 == COL_UCS4) {
    if (CVar1 == COL_UCS1) {
      if (length == 0) {
LAB_0010c0b7:
        lVar8 = *(long *)((long)clientData + 0x70);
      }
      else {
        pvVar2 = chunks->data;
        lVar8 = *(long *)((long)clientData + 0x70);
        sVar9 = 0;
        do {
          *(uint *)((long)clientData + sVar9 * 4 + lVar8 + 4) =
               (uint)*(byte *)((long)pvVar2 + sVar9);
          sVar9 = sVar9 + 1;
        } while (length != sVar9);
      }
    }
    else {
      if (CVar1 != COL_UCS2) goto LAB_0010c080;
      if (length == 0) goto LAB_0010c0b7;
      pvVar2 = chunks->data;
      lVar8 = *(long *)((long)clientData + 0x70);
      sVar9 = 0;
      do {
        *(uint *)((long)clientData + sVar9 * 4 + lVar8 + 4) =
             (uint)*(ushort *)((long)pvVar2 + sVar9 * 2);
        sVar9 = sVar9 + 1;
      } while (length != sVar9);
    }
    *(size_t *)((long)clientData + 0x68) = lVar4 + length;
    lVar8 = lVar8 + length * 4;
LAB_0010c0d7:
    *(long *)((long)clientData + 0x70) = lVar8;
    return 0;
  }
  if (CVar5 == COL_UCS2) {
    if (CVar1 == COL_UCS1) {
      if (length == 0) {
        lVar8 = *(long *)((long)clientData + 0x70);
      }
      else {
        pvVar2 = chunks->data;
        lVar8 = *(long *)((long)clientData + 0x70);
        sVar9 = 0;
        do {
          *(ushort *)((long)clientData + sVar9 * 2 + lVar8 + 4) =
               (ushort)*(byte *)((long)pvVar2 + sVar9);
          sVar9 = sVar9 + 1;
        } while (length != sVar9);
      }
      *(size_t *)((long)clientData + 0x68) = lVar4 + length;
      lVar8 = lVar8 + length * 2;
      goto LAB_0010c0d7;
    }
    if (CVar1 == COL_UCS4) {
      uVar6 = 4;
      sVar3 = 2;
      for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(uint *)((long)clientData + lVar8 * 4) =
             (uint)*(ushort *)((long)clientData + lVar8 * 2 + 2);
      }
      goto LAB_0010c077;
    }
  }
  else if (CVar5 == COL_UCS1) {
    if (CVar1 == COL_UCS2) {
      uVar6 = 2;
      sVar3 = 1;
      for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(short *)((long)clientData + lVar8 * 2 + 2) =
             (short)*(char *)((long)clientData + lVar8 + 3);
      }
    }
    else {
      if (CVar1 != COL_UCS4) goto LAB_0010c080;
      uVar6 = 4;
      sVar3 = 2;
      for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(int *)((long)clientData + lVar8 * 4) = (int)*(char *)((long)clientData + lVar8 + 3);
      }
    }
LAB_0010c077:
    *(long *)((long)clientData + 0x70) = lVar4 << sVar3;
    *(undefined4 *)clientData = uVar6;
  }
LAB_0010c080:
  lVar4 = *(long *)((long)clientData + 0x70);
  sVar9 = chunks->byteLength;
  if (0x5c < sVar9 + lVar4) {
    return -1;
  }
LAB_0010c092:
  memcpy((void *)((long)clientData + lVar4 + 4),chunks->data,sVar9);
  *(long *)((long)clientData + 0x68) = *(long *)((long)clientData + 0x68) + length;
  *(long *)((long)clientData + 0x70) = *(long *)((long)clientData + 0x70) + chunks->byteLength;
  return 0;
}

Assistant:

static int
MergeRopeChunksProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #MergeRopeChunksInfo. */
    Col_ClientData clientData)
{
    MergeRopeChunksInfo *info = (MergeRopeChunksInfo *) clientData;

    ASSERT(number == 1);
    if (info->length == 0) {
        info->format = chunks->format;
    }
    if (info->format == COL_UTF8 || info->format == COL_UTF16) {
        if (chunks->format != info->format) {
            /*
             * Don't merge UTF-8/16 with other formats.
             */

            return -1;
        }
        if (info->byteLength + chunks->byteLength
                > MAX_SHORT_LEAF_SIZE - UTFSTR_HEADER_SIZE) {
            /*
             * Data won't fit.
             */

            return -1;
        }

        /*
         * Append data.
         */

        memcpy(info->data+info->byteLength, chunks->data, chunks->byteLength);
        info->length += length;
        info->byteLength += chunks->byteLength;
        return 0;
    } else {
        size_t index;           /* For upconversions. */

        if (chunks->format == COL_UTF8 || chunks->format == COL_UTF16) {
            /*
             * Don't merge UTF-8/16 with fixed-width formats.
             */

            return -1;
        }

        /*
         * Convert and append data if needed. Conversion of existing data is
         * done in-place, so iterate backwards.
         */

        if (CHAR_WIDTH(info->format) >= CHAR_WIDTH(chunks->format)) {
            /*
             * Appended data will be upconverted.
             */

            if (info->byteLength + (length * CHAR_WIDTH(info->format))
                    > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
                /*
                 * Data won't fit.
                 */

                return -1;
            }
        } else {
            /*
             * Existing data will be upconverted.
             */

            if ((info->length + length) * CHAR_WIDTH(chunks->format)
                    > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
                /*
                 * Data won't fit.
                 */

                return -1;
            }
        }
        switch (info->format) {
        case COL_UCS1:
            switch (chunks->format) {
            case COL_UCS2:
                /*
                 * Upconvert existing data to UCS-2.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char2 *) info->data)[index] = info->data[index];
                }
                info->byteLength = info->length*sizeof(Col_Char2);
                info->format = COL_UCS2;
                break;

            case COL_UCS4:
                /*
                 * Upconvert existing data to UCS-4.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char4 *) info->data)[index] = info->data[index];
                }
                info->byteLength = info->length * sizeof(Col_Char4);
                info->format = COL_UCS4;
                break;
            }
            break;

        case COL_UCS2:
            switch (chunks->format) {
            case COL_UCS1:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char2 *) (info->data+info->byteLength))[index]
                            = ((Col_Char1 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char2);
                return 0;

            case COL_UCS4:
                /*
                 Upconvert existing data to UCS-4.
                 */

                for (index = info->length-1; index != -1; index--) {
                    ((Col_Char4 *) info->data)[index]
                            = ((Col_Char2 *) info->data)[index];
                }
                info->byteLength = info->length * sizeof(Col_Char4);
                info->format = COL_UCS4;
                break;
            }
            break;

        case COL_UCS4:
            switch (chunks->format) {
            case COL_UCS1:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char4 *) (info->data+info->byteLength))[index]
                            = ((Col_Char1 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char4);
                return 0;

            case COL_UCS2:
                /*
                 * Append data and return, upconverting in the process.
                 */

                for (index = 0; index < length; index++) {
                    ((Col_Char4 *) (info->data+info->byteLength))[index]
                            = ((Col_Char2 *) chunks->data)[index];
                }
                info->length += length;
                info->byteLength += length*sizeof(Col_Char4);
                return 0;
            }
            break;
        }

        ASSERT(info->format == chunks->format);

        if (info->byteLength + chunks->byteLength
                > MAX_SHORT_LEAF_SIZE - UCSSTR_HEADER_SIZE) {
            /*
             * Data won't fit.
             */

            return -1;
        }

        /*
         * Append data.
         */

        memcpy(info->data+info->byteLength, chunks->data, chunks->byteLength);
        info->length += length;
        info->byteLength += chunks->byteLength;
        return 0;
    }
}